

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  uint uVar1;
  int number;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint32 uVar5;
  Descriptor *pDVar6;
  LogMessage *pLVar7;
  MapFieldBase *this_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if ((CVar3 != cpptype) &&
     ((CVar3 = FieldDescriptor::cpp_type(field), cpptype != CPPTYPE_INT32 || (CVar3 != CPPTYPE_ENUM)
      ))) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
  }
  if ((desc != (Descriptor *)0x0) && (pDVar6 = FieldDescriptor::message_type(field), pDVar6 != desc)
     ) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6ad);
    pLVar7 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"wrong submessage type");
    internal::LogFinisher::operator=(&local_61,pLVar7);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    TVar4 = FieldDescriptor::type(field);
    bVar2 = FieldDescriptor::is_packed(field);
    this_00 = (MapFieldBase *)
              internal::ExtensionSet::MutableRawRepeatedField
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                         number,(FieldType)TVar4,bVar2,field);
  }
  else {
    bVar2 = FieldDescriptor::is_map(field);
    uVar5 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5)
    ;
    if (bVar2) {
      this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
    }
  }
  return this_00;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}